

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  float fVar1;
  ImGuiSizeCallback p_Var2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  ImGuiWindow *window_for_height;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  float fVar10;
  float fVar11;
  ImGuiSizeCallbackData data;
  ImGuiSizeCallbackData local_40;
  
  pIVar3 = GImGui;
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar10 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar1 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar6 = new_size.x;
    fVar7 = new_size.y;
    if ((fVar10 < 0.0) || (fVar8 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar8 < 0.0))
    {
      fVar10 = (window->SizeFull).x;
    }
    else {
      if (fVar6 <= fVar8) {
        fVar8 = fVar6;
      }
      fVar10 = (float)(-(uint)(fVar6 < fVar10) & (uint)fVar10 |
                      ~-(uint)(fVar6 < fVar10) & (uint)fVar8);
    }
    if ((fVar1 < 0.0) || (fVar6 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar6 < 0.0)) {
      fVar1 = (window->SizeFull).y;
    }
    else {
      if (fVar7 <= fVar6) {
        fVar6 = fVar7;
      }
      fVar1 = (float)(-(uint)(fVar7 < fVar1) & (uint)fVar1 | ~-(uint)(fVar7 < fVar1) & (uint)fVar6);
    }
    IVar9.y = fVar1;
    IVar9.x = fVar10;
    p_Var2 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var2 != (ImGuiSizeCallback)0x0) {
      local_40.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_40.Pos = window->Pos;
      local_40.CurrentSize = window->SizeFull;
      local_40.DesiredSize = IVar9;
      (*p_Var2)(&local_40);
      IVar9 = local_40.DesiredSize;
    }
    new_size.x = (float)(int)IVar9.x;
    new_size.y = (float)(int)IVar9.y;
  }
  if ((window->Flags & 0x1000040U) == 0) {
    fVar10 = (pIVar3->Style).WindowMinSize.x;
    fVar1 = (pIVar3->Style).WindowMinSize.y;
    fVar6 = new_size.x;
    uVar4 = -(uint)(fVar10 <= fVar6);
    uVar5 = -(uint)(fVar1 <= new_size.y);
    fVar1 = (float)(~uVar5 & (uint)fVar1 | (uint)new_size.y & uVar5);
    fVar7 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar7 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar7 = fVar7 * window->ParentWindow->FontWindowScale;
      }
      fVar8 = (GImGui->Style).FramePadding.y;
      fVar7 = fVar8 + fVar8 + fVar7;
    }
    fVar8 = ImGuiWindow::MenuBarHeight(window);
    fVar11 = (pIVar3->Style).WindowRounding + -1.0;
    fVar7 = (float)(~-(uint)(fVar11 <= 0.0) & (uint)fVar11) + fVar8 + fVar7;
    uVar5 = -(uint)(fVar7 <= fVar1);
    new_size.y = (float)(uVar5 & (uint)fVar1 | ~uVar5 & (uint)fVar7);
    new_size.x = (float)(~uVar4 & (uint)fVar10 | uVar4 & (uint)fVar6);
  }
  return new_size;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_FLOOR(new_size.x);
        new_size.y = IM_FLOOR(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        ImGuiWindow* window_for_height = window;
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window_for_height->TitleBarHeight() + window_for_height->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}